

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O2

AffineSpace3ff * __thiscall
embree::SceneGraph::MultiTransformNode::get
          (AffineSpace3ff *__return_storage_ptr__,MultiTransformNode *this,size_t i,float time)

{
  pointer pTVar1;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar2;
  Vector *pVVar3;
  Vector *pVVar4;
  pointer pTVar5;
  ulong uVar6;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar7;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined8 uVar15;
  int iVar16;
  int iVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  
  pTVar5 = (this->spaces).
           super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar1 = pTVar5 + i;
  uVar6 = pTVar5[i].spaces.size_active;
  if (uVar6 < 2) {
    pAVar7 = (pTVar1->spaces).items;
    uVar15 = *(undefined8 *)((long)&(pAVar7->l).vx.field_0 + 8);
    *(undefined8 *)&(__return_storage_ptr__->l).vx.field_0 = *(undefined8 *)&(pAVar7->l).vx.field_0;
    *(undefined8 *)((long)&(__return_storage_ptr__->l).vx.field_0 + 8) = uVar15;
    fVar19 = (pAVar7->l).vy.field_0.m128[0];
    fVar25 = *(float *)((long)&(pAVar7->l).vy.field_0 + 4);
    fVar26 = *(float *)((long)&(pAVar7->l).vy.field_0 + 8);
    fVar27 = *(float *)((long)&(pAVar7->l).vy.field_0 + 0xc);
    fVar28 = (pAVar7->l).vz.field_0.m128[0];
    fVar29 = *(float *)((long)&(pAVar7->l).vz.field_0 + 4);
    fVar30 = *(float *)((long)&(pAVar7->l).vz.field_0 + 8);
    fVar31 = *(float *)((long)&(pAVar7->l).vz.field_0 + 0xc);
    fVar21 = (pAVar7->p).field_0.m128[0];
    fVar22 = (pAVar7->p).field_0.m128[1];
    fVar23 = (pAVar7->p).field_0.m128[2];
    fVar24 = (pAVar7->p).field_0.m128[3];
  }
  else {
    fVar18 = (pTVar1->time_range).lower;
    fVar18 = (time - fVar18) / ((pTVar1->time_range).upper - fVar18);
    fVar19 = floorf(fVar18);
    iVar17 = (int)uVar6;
    fVar18 = (float)(iVar17 + -1) * (fVar18 - fVar19);
    fVar19 = floorf(fVar18);
    iVar16 = 0;
    if (0 < (int)fVar19) {
      iVar16 = (int)fVar19;
    }
    iVar17 = iVar17 + -2;
    if (iVar16 < iVar17) {
      iVar17 = iVar16;
    }
    fVar18 = fVar18 - (float)iVar17;
    pAVar8 = (pTVar1->spaces).items;
    fVar20 = 1.0 - fVar18;
    pAVar2 = pAVar8 + (long)iVar17 + 1;
    fVar9 = *(float *)((long)&(pAVar2->l).vx.field_0 + 4);
    fVar10 = *(float *)((long)&(pAVar2->l).vx.field_0 + 8);
    fVar11 = *(float *)((long)&(pAVar2->l).vx.field_0 + 0xc);
    pAVar7 = pAVar8 + iVar17;
    fVar12 = *(float *)((long)&(pAVar7->l).vx.field_0 + 4);
    fVar13 = *(float *)((long)&(pAVar7->l).vx.field_0 + 8);
    fVar14 = *(float *)((long)&(pAVar7->l).vx.field_0 + 0xc);
    pVVar3 = &pAVar8[(long)iVar17 + 1].l.vy;
    pVVar4 = &pAVar8[iVar17].l.vy;
    fVar19 = (pVVar4->field_0).m128[0] * fVar20 + (pVVar3->field_0).m128[0] * fVar18;
    fVar25 = (pVVar4->field_0).m128[1] * fVar20 + (pVVar3->field_0).m128[1] * fVar18;
    fVar26 = (pVVar4->field_0).m128[2] * fVar20 + (pVVar3->field_0).m128[2] * fVar18;
    fVar27 = (pVVar4->field_0).m128[3] * fVar20 + (pVVar3->field_0).m128[3] * fVar18;
    pVVar3 = &pAVar8[(long)iVar17 + 1].l.vz;
    pVVar4 = &pAVar8[iVar17].l.vz;
    fVar28 = (pVVar4->field_0).m128[0] * fVar20 + (pVVar3->field_0).m128[0] * fVar18;
    fVar29 = (pVVar4->field_0).m128[1] * fVar20 + (pVVar3->field_0).m128[1] * fVar18;
    fVar30 = (pVVar4->field_0).m128[2] * fVar20 + (pVVar3->field_0).m128[2] * fVar18;
    fVar31 = (pVVar4->field_0).m128[3] * fVar20 + (pVVar3->field_0).m128[3] * fVar18;
    pVVar3 = &pAVar8[(long)iVar17 + 1].p;
    pVVar4 = &pAVar8[iVar17].p;
    fVar21 = fVar20 * (pVVar4->field_0).m128[0] + fVar18 * (pVVar3->field_0).m128[0];
    fVar22 = fVar20 * (pVVar4->field_0).m128[1] + fVar18 * (pVVar3->field_0).m128[1];
    fVar23 = fVar20 * (pVVar4->field_0).m128[2] + fVar18 * (pVVar3->field_0).m128[2];
    fVar24 = fVar20 * (pVVar4->field_0).m128[3] + fVar18 * (pVVar3->field_0).m128[3];
    (__return_storage_ptr__->l).vx.field_0.m128[0] =
         *(float *)&(pAVar7->l).vx.field_0 * fVar20 + *(float *)&(pAVar2->l).vx.field_0 * fVar18;
    (__return_storage_ptr__->l).vx.field_0.m128[1] = fVar12 * fVar20 + fVar9 * fVar18;
    (__return_storage_ptr__->l).vx.field_0.m128[2] = fVar13 * fVar20 + fVar10 * fVar18;
    (__return_storage_ptr__->l).vx.field_0.m128[3] = fVar14 * fVar20 + fVar11 * fVar18;
  }
  (__return_storage_ptr__->l).vy.field_0.m128[0] = fVar19;
  (__return_storage_ptr__->l).vy.field_0.m128[1] = fVar25;
  (__return_storage_ptr__->l).vy.field_0.m128[2] = fVar26;
  (__return_storage_ptr__->l).vy.field_0.m128[3] = fVar27;
  (__return_storage_ptr__->l).vz.field_0.m128[0] = fVar28;
  (__return_storage_ptr__->l).vz.field_0.m128[1] = fVar29;
  (__return_storage_ptr__->l).vz.field_0.m128[2] = fVar30;
  (__return_storage_ptr__->l).vz.field_0.m128[3] = fVar31;
  (__return_storage_ptr__->p).field_0.m128[0] = fVar21;
  (__return_storage_ptr__->p).field_0.m128[1] = fVar22;
  (__return_storage_ptr__->p).field_0.m128[2] = fVar23;
  (__return_storage_ptr__->p).field_0.m128[3] = fVar24;
  return __return_storage_ptr__;
}

Assistant:

virtual AffineSpace3ff get(size_t i, float time) const
      {
        if (spaces[i].size() <= 1) return spaces[i][0];

        int numTimeSteps = spaces[i].size();

        BBox1f time_range = spaces[i].time_range;
        time = frac((time-time_range.lower)/time_range.size());
        time = (numTimeSteps-1)*time;
        int   itime = (int)floor(time);
        itime = min(max(itime,0),(int)numTimeSteps-2);
        float ftime = time - (float)itime;

        const AffineSpace3ff xfm0 = spaces[i][itime+0];
        const AffineSpace3ff xfm1 = spaces[i][itime+1];
        const AffineSpace3ff xfm  = lerp(xfm0,xfm1,ftime);
        return xfm;
      }